

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O2

Index __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::removeFieldsInInstructions(wasm::Module&)::
FieldRemover::getNewIndex(wasm::HeapType_unsigned_int_(void *this,HeapType type,Index index)

{
  iterator iVar1;
  key_type local_18;
  HeapType type_local;
  
  local_18.id = type.id;
  iVar1 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(*(long *)((long)this + 0x108) + 0xa0),&local_18);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    index = *(uint *)(*(long *)((long)iVar1.
                                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                      ._M_cur + 0x10) + (ulong)index * 4);
    if (((ulong)index != 0xffffffff) &&
       ((ulong)(*(long *)((long)iVar1.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                ._M_cur + 0x18) -
                *(long *)((long)iVar1.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                ._M_cur + 0x10) >> 2) <= (ulong)index)) {
      __assert_fail("newIndex < indexesAfterRemoval.size() || newIndex == RemovedField",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/GlobalTypeOptimization.cpp"
                    ,0x1b4,
                    "Index wasm::(anonymous namespace)::GlobalTypeOptimization::removeFieldsInInstructions(Module &)::FieldRemover::getNewIndex(HeapType, Index)"
                   );
    }
  }
  return index;
}

Assistant:

Index getNewIndex(HeapType type, Index index) {
        auto iter = parent.indexesAfterRemovals.find(type);
        if (iter == parent.indexesAfterRemovals.end()) {
          return index;
        }
        auto& indexesAfterRemoval = iter->second;
        auto newIndex = indexesAfterRemoval[index];
        assert(newIndex < indexesAfterRemoval.size() ||
               newIndex == RemovedField);
        return newIndex;
      }